

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check.h
# Opt level: O3

void __thiscall
mp::
SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::CheckObjs(SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
            *this,SolCheck *chk)

{
  _Manager_type *pp_Var1;
  double *pdVar2;
  ulong uVar3;
  char *pcVar4;
  VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *in_RDX;
  VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *extraout_RDX;
  _Manager_type p_Var5;
  long lVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  p_Var5 = this[-7].recomp_fn.super__Function_base._M_manager;
  uVar7 = ((long)this[-7].recomp_fn._M_invoker - (long)p_Var5 >> 3) * 0x4fbcda3ac10c9715;
  uVar3 = (chk->obj_).size_;
  if (uVar3 < uVar7) {
    uVar7 = uVar3;
  }
  if (uVar7 != 0) {
    lVar6 = uVar7 * 0x1e8;
    do {
      dVar8 = ComputeValue<mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
                        ((mp *)(p_Var5 + lVar6 + -0x1e8),(QuadraticObjective *)chk,in_RDX);
      dVar9 = ABS((chk->obj_).data_[uVar7 - 1] - dVar8);
      p_Var5 = this[-7].recomp_fn.super__Function_base._M_manager;
      pdVar2 = (double *)((long)&this[7].recomp_fn.super__Function_base._M_functor + 8);
      if (*pdVar2 <= dVar9 && dVar9 != *pdVar2) {
        pcVar4 = *(char **)(p_Var5 + lVar6 + -0x168);
        dVar10 = 0.0;
        if (((dVar8 == 0.0) && (!NAN(dVar8))) ||
           (dVar10 = ABS(dVar9 / dVar8),
           pp_Var1 = &this[7].recomp_fn.super__Function_base._M_manager,
           (double)*pp_Var1 <= dVar10 && dVar10 != (double)*pp_Var1)) {
          (chk->viol_obj_).N_ = (chk->viol_obj_).N_ + 1;
          pdVar2 = &(chk->viol_obj_).epsAbsMax_;
          if (*pdVar2 <= dVar9 && dVar9 != *pdVar2) {
            (chk->viol_obj_).epsAbsMax_ = dVar9;
            (chk->viol_obj_).nameAbs_ = pcVar4;
          }
          pdVar2 = &(chk->viol_obj_).epsRelMax_;
          if (*pdVar2 <= dVar10 && dVar10 != *pdVar2) {
            (chk->viol_obj_).epsRelMax_ = dVar10;
            (chk->viol_obj_).nameRel_ = pcVar4;
          }
        }
      }
      uVar7 = uVar7 - 1;
      in_RDX = extraout_RDX;
      lVar6 = lVar6 + -0x1e8;
    } while (uVar7 != 0);
  }
  return;
}

Assistant:

void CheckObjs(SolCheck& chk) {
    const auto& objs = MPCD( GetModel() ).get_objectives();
    // Solvers might have dummy obj.
    // Unbounded problems might have no obj value.
    for (auto i
         =std::min(objs.size(), chk.obj_vals().size());
         i--; ) {
      auto val1 = ComputeValue(objs[i], chk.x_ext());
      chk.ObjViols().CheckViol(
            {std::fabs(chk.obj_vals()[i] - val1), val1},
            MPCD( sol_feas_tol() ), MPCD( sol_feas_tol_rel() ),
            objs[i].name());
    }
  }